

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_output.cpp
# Opt level: O0

void out_int_formatted(int i)

{
  ostream *poVar1;
  int i_local;
  
  std::ostream::operator<<((ostream *)&std::cout,std::showbase);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::dec);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
  poVar1 = std::operator<<(poVar1,"\t(decimal)\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::oct);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
  poVar1 = std::operator<<(poVar1,"\t(octal)\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
  std::operator<<(poVar1,"\t(hexadecimal)\n");
  return;
}

Assistant:

void out_int_formatted(int i)
{
	std::cout << std::showbase;
	std::cout << std::dec << i << "\t(decimal)\n"
		<< std::oct << i << "\t(octal)\n"
		<< std::hex << i << "\t(hexadecimal)\n";
}